

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O3

void tsgGenGaussianSamples
               (int num_dimensions,int num_samples,double *mean,double *deviation,char *random_type,
               int random_seed,tsg_dream_random random_callback,double *samples)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  time_t tVar4;
  long lVar5;
  vector<double,_std::allocator<double>_> result;
  string rtype;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  _Any_data local_b0;
  _Manager_type local_a0;
  long local_90;
  _Any_data local_88;
  _Manager_type local_78;
  long *local_68 [2];
  long local_58 [2];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (random_seed == -1) {
    uVar3 = time((time_t *)0x0);
    lVar5 = uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0);
    tVar4 = time((time_t *)0x0);
    random_seed = (int)tVar4;
  }
  else {
    lVar5 = (ulong)(long)random_seed % 0x7fffffff +
            (ulong)((ulong)(long)random_seed % 0x7fffffff == 0);
  }
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x3ff00000;
  local_90 = lVar5;
  srand(random_seed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,random_type,(allocator<char> *)local_b0._M_pod_data);
  iVar2 = std::__cxx11::string::compare((char *)local_68);
  if (iVar2 == 0) {
    local_128._M_unused._M_object = (tsg_dream_random *)0x0;
    local_128._8_8_ = (long *)0x0;
    local_110 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:107:20)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:107:20)>
                ::_M_manager;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_68);
    if (iVar2 == 0) {
      local_128._M_unused._M_object = &local_48;
      local_128._8_8_ = &local_90;
      local_110 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:109:20)>
                  ::_M_invoke;
      local_118 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:109:20)>
                  ::_M_manager;
    }
    else {
      local_128._8_8_ = (long *)0x0;
      local_128._M_unused._M_object = &random_callback;
      local_110 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:111:20)>
                  ::_M_invoke;
      local_118 = std::
                  _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:111:20)>
                  ::_M_manager;
    }
  }
  if (mean == (double *)0x0) {
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_e8,mean,mean + num_dimensions,
               (allocator_type *)local_b0._M_pod_data);
  }
  if (deviation == (double *)0x0) {
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_108,deviation,
               deviation + num_dimensions,(allocator_type *)local_b0._M_pod_data);
  }
  std::function<double_()>::function
            ((function<double_()> *)&local_88,(function<double_()> *)&local_128);
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::function<double_()>::function
            ((function<double_()> *)&local_b0,(function<double_()> *)&local_88);
  TasDREAM::genGaussianSamples
            (&local_e8,&local_108,num_samples,&local_c8,(function<double_()> *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pdVar1 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(samples,local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void tsgGenGaussianSamples(int num_dimensions, int num_samples, double const mean[], double const deviation[],
                           const char* random_type, int random_seed, tsg_dream_random random_callback, double *samples){

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    std::vector<double> result = TasDREAM::genGaussianSamples(Utils::copyArray(mean, num_dimensions),
                                                              Utils::copyArray(deviation, num_dimensions),
                                                              num_samples, randgen);
    std::copy(result.begin(), result.end(), samples);
}